

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O1

void llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::encode
               (FileInfo *value,BinaryEncoder *coder)

{
  uint64_t uVar1;
  undefined8 in_RAX;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  int i;
  long lVar2;
  undefined8 uStack_28;
  
  uVar1 = value->device;
  uStack_28 = in_RAX;
  BinaryEncoder::write(coder,(int)uVar1,in_RDX,in_RCX);
  BinaryEncoder::write(coder,(int)(uVar1 >> 0x20),__buf,in_RCX);
  uVar1 = value->inode;
  BinaryEncoder::write(coder,(int)uVar1,__buf_00,in_RCX);
  BinaryEncoder::write(coder,(int)(uVar1 >> 0x20),__buf_01,in_RCX);
  uVar1 = value->mode;
  BinaryEncoder::write(coder,(int)uVar1,__buf_02,in_RCX);
  BinaryEncoder::write(coder,(int)(uVar1 >> 0x20),__buf_03,in_RCX);
  uVar1 = value->size;
  BinaryEncoder::write(coder,(int)uVar1,__buf_04,in_RCX);
  BinaryEncoder::write(coder,(int)(uVar1 >> 0x20),__buf_05,in_RCX);
  BinaryEncoder::write<llbuild::basic::FileTimestamp>(coder,&value->modTime);
  lVar2 = 0;
  do {
    uStack_28 = CONCAT17((value->checksum).bytes[lVar2],(undefined7)uStack_28);
    llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
              ((SmallVectorTemplateBase<unsigned_char,_true> *)coder,(uchar *)((long)&uStack_28 + 7)
              );
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  return;
}

Assistant:

static inline void encode(const FileInfo& value, BinaryEncoder& coder) {
    coder.write(value.device);
    coder.write(value.inode);
    coder.write(value.mode);
    coder.write(value.size);
    coder.write(value.modTime);
    coder.write(value.checksum);
  }